

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void __thiscall chatra::Thread::processSwitchCase(Thread *this,bool enter)

{
  pointer pFVar1;
  pointer psVar2;
  pointer psVar3;
  element_type *peVar4;
  pointer psVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  pointer psVar7;
  long lVar8;
  size_t sVar9;
  
  if ((int)CONCAT71(in_register_00000031,enter) == 0) {
    pop(this);
    return;
  }
  pFVar1 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((pFVar1[-1].node)->blockNodes).
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      ((pFVar1[-1].node)->blockNodes).
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    sVar9 = pFVar1[-2].phase;
    do {
      psVar2 = ((pFVar1[-2].node)->blockNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)((pFVar1[-2].node)->blockNodes).
                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= sVar9)
      break;
      checkIsValidNode(this,psVar2[sVar9].
                            super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      peVar4 = psVar2[sVar9].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (1 < (byte)(peVar4->type - Case)) break;
      pFVar1[-1].node = peVar4;
      sVar9 = pFVar1[-2].phase + 1;
      pFVar1[-2].phase = sVar9;
    } while ((peVar4->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (peVar4->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pFVar1[-1].phase = 0;
  psVar2 = ((pFVar1[-2].node)->blockNodes).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = ((pFVar1[-2].node)->blockNodes).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)psVar3 - (long)psVar2;
  psVar5 = psVar2;
  if (0 < (long)uVar6 >> 6) {
    psVar5 = (pointer)((long)&(psVar2->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr + (uVar6 & 0xffffffffffffffc0));
    lVar8 = ((long)uVar6 >> 6) + 1;
    psVar7 = psVar2 + 2;
    do {
      if (((psVar7[-2].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
          ~ScriptRoot) == Catch) {
        psVar7 = psVar7 + -2;
        goto LAB_0016aae9;
      }
      if (((psVar7[-1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
          ~ScriptRoot) == Catch) {
        psVar7 = psVar7 + -1;
        goto LAB_0016aae9;
      }
      if ((((psVar7->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
          ~ScriptRoot) == Catch) goto LAB_0016aae9;
      if (((psVar7[1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
          ~ScriptRoot) == Catch) {
        psVar7 = psVar7 + 1;
        goto LAB_0016aae9;
      }
      lVar8 = lVar8 + -1;
      psVar7 = psVar7 + 4;
    } while (1 < lVar8);
    uVar6 = (long)psVar3 - (long)psVar5;
  }
  lVar8 = (long)uVar6 >> 4;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      psVar7 = psVar3;
      if ((lVar8 != 3) ||
         (psVar7 = psVar5,
         (((psVar5->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
         ~ScriptRoot) == Catch)) goto LAB_0016aae9;
      psVar5 = psVar5 + 1;
    }
    psVar7 = psVar5;
    if ((((psVar5->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
        ~ScriptRoot) == Catch) goto LAB_0016aae9;
    psVar5 = psVar5 + 1;
  }
  psVar7 = psVar3;
  if ((((psVar5->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
      ~ScriptRoot) == Catch) {
    psVar7 = psVar5;
  }
LAB_0016aae9:
  pFVar1[-2].phase = (long)psVar7 - (long)psVar2 >> 4;
  return;
}

Assistant:

void Thread::processSwitchCase(bool enter) {
	if (!enter) {
		pop();
		return;
	}

	auto& f0 = *(frames.end() - 1);
	auto& f1 = *(frames.end() - 2);

	while (f0.node->blockNodes.empty() && f1.phase < f1.node->blockNodes.size()) {
		auto& nextNode = f1.node->blockNodes[f1.phase];
		checkIsValidNode(nextNode.get());
		if (nextNode->type != NodeType::Case && nextNode->type != NodeType::Default)
			break;
		f0.node = nextNode.get();
		f1.phase++;
	}

	f0.phase = 0;
	f1.phase = static_cast<size_t>(std::distance(f1.node->blockNodes.cbegin(),
			std::find_if(f1.node->blockNodes.cbegin(), f1.node->blockNodes.cend(), [](const std::shared_ptr<Node>& n) {
				return n->type == NodeType::Catch || n->type == NodeType::Finally;
			})));
}